

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_chr.c
# Opt level: O3

uint byte_chr(char *s,uint n,int c)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  char *t;
  
  iVar6 = (int)s;
  iVar1 = iVar6;
  if (n != 0) {
    cVar5 = (char)c;
    lVar4 = 0;
    pcVar2 = s;
    do {
      if (cVar5 == s[lVar4]) break;
      iVar3 = (int)lVar4;
      if (n - 1 == iVar3) {
        iVar1 = iVar6 + iVar3 + 1;
        goto LAB_00106c27;
      }
      iVar1 = (int)pcVar2;
      if (cVar5 == s[lVar4 + 1]) {
        iVar1 = iVar1 + 1;
        goto LAB_00106c27;
      }
      if (n - 2 == iVar3) {
        iVar1 = iVar1 + 2;
        goto LAB_00106c27;
      }
      if (cVar5 == s[lVar4 + 2]) {
        iVar1 = iVar6 + iVar3 + 2;
        goto LAB_00106c27;
      }
      if (n - 3 == iVar3) {
        iVar1 = iVar6 + iVar3 + 3;
        goto LAB_00106c27;
      }
      if (cVar5 == s[lVar4 + 3]) {
        iVar1 = iVar1 + 3;
        goto LAB_00106c27;
      }
      pcVar2 = pcVar2 + 4;
      lVar4 = lVar4 + 4;
    } while (n != (uint)lVar4);
    iVar1 = (int)lVar4 + iVar6;
  }
LAB_00106c27:
  return iVar1 - iVar6;
}

Assistant:

unsigned int byte_chr(s,n,c)
char *s;
register unsigned int n;
int c;
{
  register char ch;
  register char *t;

  ch = c;
  t = s;
  for (;;) {
    if (!n) break; if (*t == ch) break; ++t; --n;
    if (!n) break; if (*t == ch) break; ++t; --n;
    if (!n) break; if (*t == ch) break; ++t; --n;
    if (!n) break; if (*t == ch) break; ++t; --n;
  }
  return t - s;
}